

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmCodeTests.cpp
# Opt level: O0

void assembler::anon_unknown_1::asmcode_jmp(void)

{
  initializer_list<unsigned_char> __l;
  list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
  *this;
  reference this_00;
  reference pvVar1;
  uint64_t size_00;
  allocator<unsigned_char> local_184;
  uchar local_183 [3];
  iterator local_180;
  size_type local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  uint64_t local_158;
  uint64_t size;
  operand local_140;
  operation local_13c;
  uint8_t local_138 [8];
  uint8_t buffer [255];
  asmcode code;
  
  assembler::asmcode::asmcode((asmcode *)(buffer + 0xf8));
  local_13c = JMP;
  local_140 = R11;
  asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)(buffer + 0xf8),&local_13c,&local_140);
  this = (list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
          *)assembler::asmcode::get_instructions_list_abi_cxx11_();
  this_00 = std::__cxx11::
            list<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>,_std::allocator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>
            ::front(this);
  pvVar1 = std::
           vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
           ::operator[](this_00,0);
  size_00 = assembler::asmcode::instruction::fill_opcode((uchar *)pvVar1);
  local_183[0] = 'A';
  local_183[1] = 0xff;
  local_183[2] = 0xe3;
  local_180 = local_183;
  local_178 = 3;
  local_158 = size_00;
  std::allocator<unsigned_char>::allocator(&local_184);
  __l._M_len = local_178;
  __l._M_array = local_180;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_170,__l,&local_184);
  _check_buffer(local_138,size_00,&local_170);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_170);
  std::allocator<unsigned_char>::~allocator(&local_184);
  assembler::asmcode::~asmcode((asmcode *)(buffer + 0xf8));
  return;
}

Assistant:

void asmcode_jmp()
    {
    asmcode code; uint8_t buffer[255];
    code.add(asmcode::JMP, asmcode::R11);
    uint64_t size;
    size = code.get_instructions_list().front()[0].fill_opcode(buffer);
    _check_buffer(buffer, size, { 0x41, 0xFF, 0xE3 });
    }